

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_array.cc
# Opt level: O0

string * __thiscall
ArrayType::GenArrayInit_abi_cxx11_(ArrayType *this,Output *out_cc,Env *env,bool known_array_length)

{
  bool bVar1;
  char *pcVar2;
  undefined8 uVar3;
  Env *this_00;
  ID *in_RDX;
  Type *in_RSI;
  string *in_RDI;
  byte in_R8B;
  string *array_str;
  ID *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  ID *id;
  
  std::__cxx11::string::string((string *)in_RDI);
  pcVar2 = Type::lvalue((Type *)0x123030);
  std::__cxx11::string::operator=((string *)in_RDI,pcVar2);
  bVar1 = Type::incremental_parsing(in_RSI);
  if (bVar1) {
    elem_it_var((ArrayType *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    pcVar2 = Env::LValue((Env *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
    Output::println((Output *)in_RDX,"if ( %s < 0 )",pcVar2);
    Output::inc_indent((Output *)in_RDX);
    Output::println((Output *)in_RDX,"{");
    Output::println((Output *)in_RDX,"// Initialize only once");
    elem_it_var((ArrayType *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    pcVar2 = Env::LValue((Env *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                         in_stack_ffffffffffffff18);
    Output::println((Output *)in_RDX,"%s = 0;",pcVar2);
  }
  pcVar2 = Type::lvalue((Type *)0x1231ba);
  uVar3 = std::__cxx11::string::c_str();
  Output::println((Output *)in_RDX,"%s = new %s;",pcVar2,uVar3);
  if ((in_R8B & 1) != 0) {
    id = in_RDX;
    this_00 = (Env *)Type::lvalue((Type *)0x123216);
    arraylength_var((ArrayType *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    pcVar2 = Env::RValue(this_00,id);
    Output::println((Output *)id,"%s->reserve(%s);",this_00,pcVar2);
  }
  bVar1 = Type::incremental_parsing(in_RSI);
  if (bVar1) {
    Output::println((Output *)in_RDX,"}");
    Output::dec_indent((Output *)in_RDX);
  }
  return in_RDI;
}

Assistant:

string ArrayType::GenArrayInit(Output* out_cc, Env* env, bool known_array_length)
	{
	string array_str;

	array_str = lvalue();
	if ( incremental_parsing() )
		{
		out_cc->println("if ( %s < 0 )", env->LValue(elem_it_var()));
		out_cc->inc_indent();
		out_cc->println("{");
		out_cc->println("// Initialize only once");
		out_cc->println("%s = 0;", env->LValue(elem_it_var()));
		}

	out_cc->println("%s = new %s;", lvalue(), vector_str_.c_str());

	if ( known_array_length )
		{
		out_cc->println("%s->reserve(%s);", lvalue(), env->RValue(arraylength_var()));
		}

	if ( incremental_parsing() )
		{
		out_cc->println("}");
		out_cc->dec_indent();
		}

	return array_str;
	}